

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_serverwindow.h
# Opt level: O0

void __thiscall Ui_ServerWindow::setupUi(Ui_ServerWindow *this,QWidget *ServerWindow)

{
  QWidget *pQVar1;
  bool bVar2;
  QGridLayout *pQVar3;
  QLabel *pQVar4;
  QPlainTextEdit *pQVar5;
  QSpacerItem *pQVar6;
  QPushButton *pQVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QFlags<Qt::AlignmentFlag> local_124;
  QByteArrayView local_120;
  QString local_110;
  QFlags<Qt::AlignmentFlag> local_f8;
  QFlags<Qt::AlignmentFlag> local_f4;
  QByteArrayView local_f0;
  QString local_e0;
  QFlags<Qt::AlignmentFlag> local_c4;
  QByteArrayView local_c0;
  QString local_b0;
  QFlags<Qt::WindowType> local_94;
  QByteArrayView local_90;
  QString local_80;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QWidget *local_18;
  QWidget *ServerWindow_local;
  Ui_ServerWindow *this_local;
  
  local_18 = ServerWindow;
  ServerWindow_local = (QWidget *)this;
  QObject::objectName();
  bVar2 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar1 = local_18;
  if (bVar2) {
    QByteArrayView::QByteArrayView<13ul>(&local_68,(char (*) [13])"ServerWindow");
    QVar8.m_data = (storage_type *)local_68.m_size;
    QVar8.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar8);
    QObject::setObjectName((QString *)pQVar1);
    QString::~QString(&local_58);
  }
  QWidget::resize(local_18,400,300);
  pQVar3 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar3,local_18);
  this->gridLayout = pQVar3;
  pQVar3 = this->gridLayout;
  QByteArrayView::QByteArrayView<11ul>(&local_90,(char (*) [11])"gridLayout");
  QVar9.m_data = (storage_type *)local_90.m_size;
  QVar9.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_80);
  pQVar4 = (QLabel *)operator_new(0x28);
  pQVar1 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_94);
  QLabel::QLabel(pQVar4,pQVar1,(QFlags_conflict *)(ulong)local_94.i);
  this->label = pQVar4;
  pQVar4 = this->label;
  QByteArrayView::QByteArrayView<6ul>(&local_c0,(char (*) [6])"label");
  QVar10.m_data = (storage_type *)local_c0.m_size;
  QVar10.m_size = (qsizetype)&local_b0;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_b0);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar4 = this->label;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_c4);
  QGridLayout::addWidget(pQVar1,(int)pQVar4,0,0,1,(QFlags_conflict *)0x2);
  pQVar5 = (QPlainTextEdit *)operator_new(0x28);
  QPlainTextEdit::QPlainTextEdit(pQVar5,local_18);
  this->logEditor = pQVar5;
  pQVar5 = this->logEditor;
  QByteArrayView::QByteArrayView<10ul>(&local_f0,(char (*) [10])"logEditor");
  QVar11.m_data = (storage_type *)local_f0.m_size;
  QVar11.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_e0);
  QPlainTextEdit::setReadOnly(SUB81(this->logEditor,0));
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar5 = this->logEditor;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_f4);
  QGridLayout::addWidget(pQVar1,(int)pQVar5,1,0,1,(QFlags_conflict *)0x2);
  pQVar6 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(pQVar6,0x12a,0x14,Expanding,Minimum);
  this->horizontalSpacer = pQVar6;
  pQVar3 = this->gridLayout;
  pQVar6 = this->horizontalSpacer;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_f8);
  QGridLayout::addItem((QLayoutItem *)pQVar3,(int)pQVar6,2,0,1,(QFlags_conflict *)0x1);
  pQVar7 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar7,local_18);
  this->startStopButton = pQVar7;
  pQVar7 = this->startStopButton;
  QByteArrayView::QByteArrayView<16ul>(&local_120,(char (*) [16])"startStopButton");
  QVar12.m_data = (storage_type *)local_120.m_size;
  QVar12.m_size = (qsizetype)&local_110;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_110);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar7 = this->startStopButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_124);
  QGridLayout::addWidget(pQVar1,(int)pQVar7,2,1,1,(QFlags_conflict *)0x1);
  retranslateUi(this,local_18);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QWidget *ServerWindow)
    {
        if (ServerWindow->objectName().isEmpty())
            ServerWindow->setObjectName(QString::fromUtf8("ServerWindow"));
        ServerWindow->resize(400, 300);
        gridLayout = new QGridLayout(ServerWindow);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        label = new QLabel(ServerWindow);
        label->setObjectName(QString::fromUtf8("label"));

        gridLayout->addWidget(label, 0, 0, 1, 2);

        logEditor = new QPlainTextEdit(ServerWindow);
        logEditor->setObjectName(QString::fromUtf8("logEditor"));
        logEditor->setReadOnly(true);

        gridLayout->addWidget(logEditor, 1, 0, 1, 2);

        horizontalSpacer = new QSpacerItem(298, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        gridLayout->addItem(horizontalSpacer, 2, 0, 1, 1);

        startStopButton = new QPushButton(ServerWindow);
        startStopButton->setObjectName(QString::fromUtf8("startStopButton"));

        gridLayout->addWidget(startStopButton, 2, 1, 1, 1);


        retranslateUi(ServerWindow);

        QMetaObject::connectSlotsByName(ServerWindow);
    }